

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2a3a2a::ImageOptimizer::provideStreamData
          (ImageOptimizer *this,QPDFObjGen *param_1,Pipeline *pipeline)

{
  shared_ptr<Pipeline> p;
  allocator<char> local_41;
  undefined1 local_40 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,"",&local_41);
  makePipeline((ImageOptimizer *)(local_40 + 0x20),(string *)this,(Pipeline *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  if ((Pipeline *)local_40._32_8_ == (Pipeline *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_40,
               "unable to create pipeline after previous success; image data will be lost",&local_41
              );
    QPDFObjectHandle::warnIfPossible(&this->image,(string *)local_40);
    std::__cxx11::string::~string((string *)local_40);
    (*pipeline->_vptr_Pipeline[3])(pipeline);
  }
  else {
    QPDFObjectHandle::pipeStreamData
              (&this->image,(Pipeline *)local_40._32_8_,0,this->decode_level,false,false);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return;
}

Assistant:

void
ImageOptimizer::provideStreamData(QPDFObjGen const&, Pipeline* pipeline)
{
    std::shared_ptr<Pipeline> p = makePipeline("", pipeline);
    if (p == nullptr) {
        // Should not be possible
        image.warnIfPossible(
            "unable to create pipeline after previous success; image data will be lost");
        pipeline->finish();
        return;
    }
    image.pipeStreamData(p.get(), 0, decode_level, false, false);
}